

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O1

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,Assignment *e)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  Assignment *local_10;
  
  local_38._M_unused._M_object = &local_10;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/evaluator/DefaultEvaluator.cpp:344:13)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/federico-terzi[P]ninx/lib/evaluator/DefaultEvaluator.cpp:344:13)>
             ::_M_manager;
  local_38._8_8_ = this;
  local_10 = e;
  no_echo((function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::Assignment *e) {
    no_echo([&]{
        // Evaluate the expression
        reset_return_block();
        e->get_value()->accept(this);

        // Get the result as a unique pointer and move it to the block scope
        auto result {get_owned_return_block()};

        // Obtain the correct object by traversing the name structure
        std::string field_name;
        auto target_object { navigate_object_tree(e->get_parent(), e->get_name(), field_name) };

        target_object->set_variable(field_name, std::move(result), false);
    });
}